

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::HlslParseContext::handleLoopAttributes
          (HlslParseContext *this,TSourceLoc *loc,TIntermLoop *loop,TAttributes *attributes)

{
  _List_node_base *p_Var1;
  _List_node_header *p_Var2;
  
  if (loop != (TIntermLoop *)0x0) {
    p_Var2 = &(attributes->
              super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
              ).
              super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
              ._M_impl._M_node;
    p_Var1 = &p_Var2->super__List_node_base;
    while (p_Var1 = ((_List_node_base *)&p_Var1->_M_next)->_M_next,
          (_List_node_header *)p_Var1 != p_Var2) {
      if (*(int *)&p_Var1[1]._M_next == 0x13) {
        loop->dontUnroll = true;
        loop->peelCount = 0;
        loop->partialCount = 0;
      }
      else if (*(int *)&p_Var1[1]._M_next == 0x12) {
        loop->unroll = true;
      }
      else {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                  (this,loc,"attribute does not apply to a loop","","");
      }
    }
  }
  return;
}

Assistant:

void HlslParseContext::handleLoopAttributes(const TSourceLoc& loc, TIntermLoop* loop,
    const TAttributes& attributes)
{
    if (loop == nullptr)
        return;

    for (auto it = attributes.begin(); it != attributes.end(); ++it) {
        switch (it->name) {
        case EatUnroll:
            loop->setUnroll();
            break;
        case EatLoop:
            loop->setDontUnroll();
            break;
        default:
            warn(loc, "attribute does not apply to a loop", "", "");
            break;
        }
    }
}